

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_join_leave.cxx
# Opt level: O0

void __thiscall nuraft::raft_server::reset_srv_to_join(raft_server *this)

{
  element_type *peVar1;
  int __how;
  int __fd;
  __shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *in_RDI;
  __shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> *unaff_retaddr;
  peer *in_stack_00000078;
  raft_server *in_stack_00000080;
  
  peVar1 = std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*(in_RDI);
  __fd = (int)peVar1;
  clear_snapshot_sync_ctx(in_stack_00000080,in_stack_00000078);
  peVar1 = std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )0x274edd);
  peer::shutdown(peVar1,__fd,__how);
  std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::reset(unaff_retaddr);
  return;
}

Assistant:

void raft_server::reset_srv_to_join() {
    clear_snapshot_sync_ctx(*srv_to_join_);
    srv_to_join_->shutdown();
    srv_to_join_.reset();
}